

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSceneManager.cpp
# Opt level: O3

IDummyTransformationSceneNode * __thiscall
irr::scene::CSceneManager::addDummyTransformationSceneNode
          (CSceneManager *this,ISceneNode *parent,s32 id)

{
  int *piVar1;
  long lVar2;
  CDummyTransformationSceneNode *this_00;
  
  if (parent == (ISceneNode *)0x0) {
    parent = (ISceneNode *)&(this->super_ISceneManager).field_0x8;
  }
  this_00 = (CDummyTransformationSceneNode *)operator_new(0x150);
  CDummyTransformationSceneNode::CDummyTransformationSceneNode
            (this_00,parent,&this->super_ISceneManager,id);
  lVar2 = *(long *)(*(long *)this_00 + -0x18);
  piVar1 = (int *)(&this_00->field_0x10 + lVar2);
  *piVar1 = *piVar1 + -1;
  if (*piVar1 == 0) {
    (**(code **)(*(long *)(&this_00->field_0x0 + lVar2) + 8))();
  }
  return (IDummyTransformationSceneNode *)this_00;
}

Assistant:

IDummyTransformationSceneNode *CSceneManager::addDummyTransformationSceneNode(
		ISceneNode *parent, s32 id)
{
	if (!parent)
		parent = this;

	IDummyTransformationSceneNode *node = new CDummyTransformationSceneNode(
			parent, this, id);
	node->drop();

	return node;
}